

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ui-prefs.c
# Opt level: O1

_Bool prefs_save(char *path,_func_void_ang_file_ptr *dump,char *title)

{
  byte bVar1;
  _Bool _Var2;
  byte bVar3;
  int iVar4;
  ang_file *paVar5;
  ang_file *f;
  bool bVar6;
  char new_fname [1024];
  char old_fname [1024];
  char end_line [1024];
  char start_line [1024];
  char buf [1024];
  char local_1438 [1024];
  char local_1038 [1024];
  char local_c38 [1024];
  char local_838 [1024];
  char local_438 [1032];
  
  file_get_tempfile(local_1438,0x400,path,"new");
  strnfmt(local_838,0x400,"%s begin %s","#=#=#=#=#=#=#=#=#=#=#=#=#=#=#=#=#=#=#=#",title);
  strnfmt(local_c38,0x400,"%s end %s","#=#=#=#=#=#=#=#=#=#=#=#=#=#=#=#=#=#=#=#",title);
  paVar5 = file_open(path,MODE_READ,FTYPE_TEXT);
  if (paVar5 != (ang_file *)0x0) {
    f = file_open(local_1438,MODE_WRITE,FTYPE_TEXT);
    if (f == (ang_file *)0x0) {
      file_close(paVar5);
      msg("Failed to create file %s",local_1438);
    }
    else {
      _Var2 = file_getl(paVar5,local_438,0x400);
      if (_Var2) {
        bVar1 = 0;
        bVar6 = false;
        do {
          iVar4 = strcmp(local_438,local_838);
          if (iVar4 == 0) {
            bVar1 = 1;
LAB_001e786f:
            bVar3 = 0;
          }
          else {
            iVar4 = strcmp(local_438,local_c38);
            if (iVar4 != 0) goto LAB_001e786f;
            bVar3 = 1;
            bVar1 = 0;
            bVar6 = true;
          }
          if (!(bool)(bVar3 | bVar1)) {
            file_putf(f,"%s\n",local_438);
          }
          _Var2 = file_getl(paVar5,local_438,0x400);
        } while (_Var2);
        file_close(paVar5);
        file_close(f);
        if (bVar6) {
          file_get_tempfile(local_1038,0x400,path,"old");
          _Var2 = file_move(path,local_1038);
          if (_Var2) {
            file_move(local_1438,path);
            file_delete(local_1038);
          }
          goto LAB_001e794c;
        }
      }
      else {
        file_close(paVar5);
        file_close(f);
      }
      file_delete(local_1438);
    }
  }
LAB_001e794c:
  paVar5 = file_open(path,MODE_APPEND,FTYPE_TEXT);
  if (paVar5 != (ang_file *)0x0) {
    file_putf(paVar5,"%s begin %s\n","#=#=#=#=#=#=#=#=#=#=#=#=#=#=#=#=#=#=#=#",title);
    file_putf(paVar5,"# *Warning!*  The lines below are an automatic dump.\n");
    file_putf(paVar5,"# Don\'t edit them; changes will be deleted and replaced automatically.\n");
    file_putf(paVar5,"\n");
    (*dump)(paVar5);
    file_putf(paVar5,"\n");
    file_putf(paVar5,"# *Warning!*  The lines above are an automatic dump.\n");
    file_putf(paVar5,"# Don\'t edit them; changes will be deleted and replaced automatically.\n");
    file_putf(paVar5,"%s end %s\n","#=#=#=#=#=#=#=#=#=#=#=#=#=#=#=#=#=#=#=#",title);
    file_close(paVar5);
  }
  return paVar5 != (ang_file *)0x0;
}

Assistant:

bool prefs_save(const char *path, void (*dump)(ang_file *), const char *title)
{
	ang_file *fff;

	/* Remove old keymaps */
	remove_old_dump(path, title);

	fff = file_open(path, MODE_APPEND, FTYPE_TEXT);
	if (!fff) {
		return false;
	}

	/* Append the header */
	pref_header(fff, title);
	file_putf(fff, "\n");

	dump(fff);

	file_putf(fff, "\n");
	pref_footer(fff, title);
	file_close(fff);

	return true;
}